

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void __thiscall libtorrent::aux::rc4_handler::encrypt(rc4_handler *this,char *__block,int __edflag)

{
  bool bVar1;
  span<char> *psVar2;
  uchar *out;
  ulong uVar3;
  undefined4 in_register_00000014;
  int len;
  uchar *pos;
  span<char> *buf;
  span<char> *__end2;
  span<char> *__begin2;
  span<libtorrent::span<char>_> *__range2;
  int local_40;
  int bytes_processed;
  undefined1 local_38 [8];
  span<libtorrent::span<const_char>_> empty;
  rc4_handler *this_local;
  span<libtorrent::span<char>_> bufs_local;
  
  this_local = (rc4_handler *)CONCAT44(in_register_00000014,__edflag);
  empty.m_len = (difference_type)__block;
  bufs_local.m_len = (difference_type)this;
  span<libtorrent::span<const_char>_>::span((span<libtorrent::span<const_char>_> *)local_38);
  if ((__block[0x218] & 1U) == 0) {
    bytes_processed = 0;
    ::std::make_tuple<int,libtorrent::span<libtorrent::span<char_const>>&>
              ((tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *)this,&bytes_processed
               ,(span<libtorrent::span<const_char>_> *)local_38);
  }
  else {
    bVar1 = span<libtorrent::span<char>_>::empty((span<libtorrent::span<char>_> *)&this_local);
    if (bVar1) {
      local_40 = 0;
      ::std::make_tuple<int,libtorrent::span<libtorrent::span<char_const>>&>
                ((tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *)this,&local_40,
                 (span<libtorrent::span<const_char>_> *)local_38);
    }
    else {
      __range2._4_4_ = 0;
      __end2 = span<libtorrent::span<char>_>::begin((span<libtorrent::span<char>_> *)&this_local);
      psVar2 = span<libtorrent::span<char>_>::end((span<libtorrent::span<char>_> *)&this_local);
      for (; __end2 != psVar2; __end2 = __end2 + 1) {
        out = (uchar *)span<char>::data(__end2);
        uVar3 = span<char>::size(__end2);
        __range2._4_4_ = (int)uVar3 + __range2._4_4_;
        rc4_encrypt(out,uVar3 & 0xffffffff,(rc4 *)(__block + 0x110));
      }
      ::std::make_tuple<int&,libtorrent::span<libtorrent::span<char_const>>&>
                ((tuple<int,_libtorrent::span<libtorrent::span<const_char>_>_> *)this,
                 (int *)((long)&__range2 + 4),(span<libtorrent::span<const_char>_> *)local_38);
    }
  }
  return;
}

Assistant:

std::tuple<int, span<span<char const>>>
	rc4_handler::encrypt(span<span<char>> bufs)
	{
		span<span<char const>> empty;
		if (!m_encrypt) return std::make_tuple(0, empty);
		if (bufs.empty()) return std::make_tuple(0, empty);

		int bytes_processed = 0;
		for (auto& buf : bufs)
		{
			auto* const pos = reinterpret_cast<unsigned char*>(buf.data());
			int const len = int(buf.size());

			TORRENT_ASSERT(len >= 0);
			TORRENT_ASSERT(pos);

			bytes_processed += len;
			rc4_encrypt(pos, std::uint32_t(len), &m_rc4_outgoing);
		}
		return std::make_tuple(bytes_processed, empty);
	}